

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

Result __thiscall Lexer::lex(Lexer *this,string *fn)

{
  vector<Token,_std::allocator<Token>_> *this_00;
  pointer pTVar1;
  int iVar2;
  Action AVar3;
  Result RVar4;
  undefined8 in_RAX;
  FILE *__stream;
  undefined8 uStack_28;
  
  __stream = _stdin;
  uStack_28 = in_RAX;
  if (fn->_M_string_length != 0) {
    __stream = fopen((fn->_M_dataplus)._M_p,"r");
  }
  if (__stream == (FILE *)0x0) {
    RVar4 = ErrorOpeningFile;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->data);
    this_00 = &(this->data).tokens;
    pTVar1 = (this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    std::vector<Token,_std::allocator<Token>_>::reserve(this_00,0x80);
    this->state = ReadingWhitespace;
    this->prepro = false;
    (this->reader).f = (FILE *)__stream;
    do {
      iVar2 = CharReader::nextchar(&this->reader);
      this->chr = iVar2;
      do {
        AVar3 = process(this);
      } while (AVar3 != NextChr);
    } while (this->chr != 0);
    (this->data).readed_bytes = (this->reader).readed_bytes_;
    uStack_28 = CONCAT44(0xb,(undefined4)uStack_28);
    std::vector<Token,std::allocator<Token>>::emplace_back<TokenKind,TextPos_const&>
              ((vector<Token,std::allocator<Token>> *)this_00,(TokenKind *)((long)&uStack_28 + 4),
               &(this->reader).pos_);
    fclose(__stream);
    RVar4 = OK;
  }
  return RVar4;
}

Assistant:

Lexer::Result Lexer::lex(const std::string& fn)
{
  std::FILE* f = (fn.empty() ? stdin: std::fopen(fn.c_str(), "r"));
  if (!f)
    return Lexer::Result::ErrorOpeningFile;

  Scoped_fclose fc(f);

  data.fn = fn;
  data.tokens.clear();
  data.tokens.reserve(128); // TODO This number might depend on the
                            //      size of the input file
  state = LexState::ReadingWhitespace;
  prepro = false;

  reader.set_file(f);
  do {
    chr = reader.nextchar();
    while (process() == Action::ProcessChr)
      ;
  } while (chr);
  data.readed_bytes = reader.readed_bytes();
  data.add_token(TokenKind::Eof, reader.pos());
  return Lexer::Result::OK;
}